

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

Texture * rw::Texture::streamRead(Stream *stream)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  bool bVar4;
  uint32 uVar5;
  Texture *this;
  uint uVar6;
  long lVar7;
  size_t __nbytes;
  uint uVar8;
  uint32 length;
  char mask [128];
  char name [128];
  uint local_13c;
  undefined1 local_138 [128];
  undefined1 local_b8 [136];
  
  bVar4 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar4) {
    uVar5 = Stream::readU32(stream);
    uVar8 = (uVar5 & 0xf00) << 4;
    if ((uVar5 & 0xf000) != 0) {
      uVar8 = 0;
    }
    bVar4 = findChunk(stream,2,&local_13c,(uint32 *)0x0);
    if (bVar4) {
      (*stream->_vptr_Stream[4])(stream,local_b8,(ulong)local_13c);
      bVar4 = findChunk(stream,2,&local_13c,(uint32 *)0x0);
      if (bVar4) {
        (*stream->_vptr_Stream[4])(stream,local_138,(ulong)local_13c);
        lVar3 = engine;
        lVar7 = (long)textureModuleOffset;
        uVar1 = *(undefined4 *)(engine + 0x18 + lVar7);
        uVar2 = *(undefined4 *)(engine + 0x1c + lVar7);
        if ((uVar5 & 0xff) - 3 < 4) {
          *(undefined4 *)(engine + 0x18 + lVar7) = 1;
          uVar6 = (uint)((uVar5 >> 0x10 & 1) == 0);
        }
        else {
          *(undefined4 *)(engine + 0x18 + lVar7) = 0;
          uVar6 = 0;
        }
        __nbytes = (size_t)textureModuleOffset;
        *(uint *)(lVar3 + 0x1c + __nbytes) = uVar6;
        this = (Texture *)read((int)local_b8,local_138,__nbytes);
        lVar3 = engine;
        *(undefined4 *)(engine + 0x18 + (long)textureModuleOffset) = uVar1;
        *(undefined4 *)(lVar3 + 0x1c + (long)textureModuleOffset) = uVar2;
        if (this == (Texture *)0x0) {
          PluginList::streamSkip((PluginList *)&s_plglist,stream);
        }
        else {
          if (this->refCount == 1) {
            this->filterAddressing = uVar8 | uVar5 & 0xffff;
          }
          bVar4 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
          if (bVar4) {
            return this;
          }
          destroy(this);
        }
      }
      else {
        streamRead();
      }
    }
    else {
      streamRead();
    }
  }
  else {
    streamRead();
  }
  return (Texture *)0x0;
}

Assistant:

Texture*
Texture::streamRead(Stream *stream)
{
	uint32 length;
	char name[128], mask[128];
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	uint32 filterAddressing = stream->readU32();
	// if V addressing is 0, copy U
	if((filterAddressing & 0xF000) == 0)
		filterAddressing |= (filterAddressing&0xF00) << 4;

	// if using mipmap filter mode, set automipmapping,
	// if 0x10000 is set, set mipmapping

	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		return nil;
	}
	stream->read8(name, length);

	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		return nil;
	}
	stream->read8(mask, length);

	bool32 mipState = getMipmapping();
	bool32 autoMipState = getAutoMipmapping();
	int32 filter = filterAddressing&0xFF;
	if(filter == MIPNEAREST || filter == MIPLINEAR ||
	   filter == LINEARMIPNEAREST || filter == LINEARMIPLINEAR){
		setMipmapping(1);
		setAutoMipmapping((filterAddressing&0x10000) == 0);
	}else{
		setMipmapping(0);
		setAutoMipmapping(0);
	}

	Texture *tex = Texture::read(name, mask);

	setMipmapping(mipState);
	setAutoMipmapping(autoMipState);

	if(tex == nil){
		s_plglist.streamSkip(stream);
		return nil;
	}
	if(tex->refCount == 1)
		tex->filterAddressing = filterAddressing&0xFFFF;

	if(s_plglist.streamRead(stream, tex))
		return tex;

	tex->destroy();
	return nil;
}